

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O1

RefToken antlr::CommonToken::factory(void)

{
  Token *pTVar1;
  TokenRef *in_RDI;
  
  pTVar1 = (Token *)operator_new(0x40);
  pTVar1->ref = (TokenRef *)0x0;
  pTVar1->type = 0;
  pTVar1->_vptr_Token = (_func_int **)&PTR__CommonToken_00309330;
  *(undefined8 *)&pTVar1->field_0x14 = 0x100000001;
  pTVar1[1].ref = (TokenRef *)(pTVar1 + 2);
  *(undefined8 *)&pTVar1[1].type = 0;
  *(undefined1 *)&pTVar1[2]._vptr_Token = 0;
  pTVar1 = (Token *)TokenRef::getRef(pTVar1);
  in_RDI->ptr = pTVar1;
  return (RefToken)in_RDI;
}

Assistant:

RefToken CommonToken::factory()
{
	return RefToken(new CommonToken);
}